

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_AutoChain_Test::TestBody(SSLVersionTest_AutoChain_Test *this)

{
  UniquePtr<X509> *this_00;
  undefined8 uVar1;
  int iVar2;
  X509_STORE *pXVar3;
  stack_st_X509 *psVar4;
  char *in_R9;
  bool bVar5;
  initializer_list<x509_st_*> __l;
  initializer_list<x509_st_*> __l_00;
  initializer_list<x509_st_*> __l_01;
  initializer_list<x509_st_*> __l_02;
  initializer_list<x509_st_*> __l_03;
  initializer_list<x509_st_*> __l_04;
  initializer_list<x509_st_*> __l_05;
  initializer_list<x509_st_*> __l_06;
  AssertHelper AStack_b8;
  _Head_base<0UL,_x509_st_*,_false> local_b0;
  tuple<x509_st_*,_bssl::internal::Deleter> local_a8;
  AssertionResult gtest_ar_;
  UniquePtr<X509> intermediate;
  undefined1 local_88 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  size_type sStack_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined8 local_38;
  
  GetChainTestCertificate();
  uVar1 = local_88._0_8_;
  this_00 = &(this->super_SSLVersionTest).cert_;
  local_88._0_8_ = (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
  std::__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>::reset
            ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter> *)this_00,(pointer)uVar1);
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)local_88);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  bVar5 = (this->super_SSLVersionTest).cert_._M_t.
          super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_x509_st_*,_false>._M_head_impl == (x509_st *)0x0;
  gtest_ar_.success_ = !bVar5;
  if (bVar5) {
    testing::Message::Message((Message *)&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_88,(internal *)&gtest_ar_,(AssertionResult *)"cert_","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&intermediate,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x110e,(char *)local_88._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&intermediate,(Message *)&local_b0);
LAB_0017b5e5:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&intermediate);
    std::__cxx11::string::~string((string *)local_88);
    if (local_b0._M_head_impl != (x509_st *)0x0) {
      (*(code *)(local_b0._M_head_impl)->cert_info->serialNumber)();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    return;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  GetChainTestKey();
  uVar1 = local_88._0_8_;
  local_88._0_8_ = (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
  std::__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>::reset
            ((__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter> *)
             &(this->super_SSLVersionTest).key_,(pointer)uVar1);
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)local_88);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (this->super_SSLVersionTest).key_._M_t.
       super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl != (evp_pkey_st *)0x0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_88,(internal *)&gtest_ar_,(AssertionResult *)0x30c54a,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&intermediate,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1110,(char *)local_88._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&intermediate,(Message *)&local_b0);
    goto LAB_0017b5e5;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  GetChainTestIntermediate();
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
       intermediate._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
       (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
  if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
      intermediate._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_x509_st_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
    testing::Message::Message((Message *)&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_88,(internal *)&gtest_ar_,(AssertionResult *)"intermediate","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1112,(char *)local_88._0_8_);
    testing::internal::AssertHelper::operator=(&AStack_b8,(Message *)&local_b0);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    gtest_ar_.success_ =
         SSLVersionTest::UseCertAndKey
                   (&this->super_SSLVersionTest,
                    (this->super_SSLVersionTest).client_ctx_._M_t.
                    super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (gtest_ar_.success_) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      gtest_ar_.success_ =
           SSLVersionTest::UseCertAndKey
                     (&this->super_SSLVersionTest,
                      (this->super_SSLVersionTest).server_ctx_._M_t.
                      super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      if (gtest_ar_.success_) {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        pXVar3 = SSL_CTX_get_cert_store
                           ((SSL_CTX *)
                            (this->super_SSLVersionTest).client_ctx_._M_t.
                            super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
        iVar2 = X509_STORE_add_cert(pXVar3,(X509 *)intermediate._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_x509_st_*,_false>.
                                                  _M_head_impl);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = iVar2 != 0;
        if (iVar2 == 0) {
          testing::Message::Message((Message *)&local_b0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_88,(internal *)&gtest_ar_,
                     (AssertionResult *)
                     "X509_STORE_add_cert(SSL_CTX_get_cert_store(client_ctx_.get()), intermediate.get())"
                     ,"false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&AStack_b8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x111a,(char *)local_88._0_8_);
          testing::internal::AssertHelper::operator=(&AStack_b8,(Message *)&local_b0);
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          pXVar3 = SSL_CTX_get_cert_store
                             ((SSL_CTX *)
                              (this->super_SSLVersionTest).server_ctx_._M_t.
                              super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
          iVar2 = X509_STORE_add_cert(pXVar3,(X509 *)intermediate._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_x509_st_*,_false>.
                                                  _M_head_impl);
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar_.success_ = iVar2 != 0;
          if (iVar2 == 0) {
            testing::Message::Message((Message *)&local_b0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_88,(internal *)&gtest_ar_,
                       (AssertionResult *)
                       "X509_STORE_add_cert(SSL_CTX_get_cert_store(server_ctx_.get()), intermediate.get())"
                       ,"false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&AStack_b8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x111c,(char *)local_88._0_8_);
            testing::internal::AssertHelper::operator=(&AStack_b8,(Message *)&local_b0);
          }
          else {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
            SSL_CTX_set_verify((SSL_CTX *)
                               (this->super_SSLVersionTest).client_ctx_._M_t.
                               super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,3,
                               (callback *)0x0);
            SSL_CTX_set_verify((SSL_CTX *)
                               (this->super_SSLVersionTest).server_ctx_._M_t.
                               super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,3,
                               (callback *)0x0);
            SSL_CTX_set_cert_verify_callback
                      ((SSL_CTX *)
                       (this->super_SSLVersionTest).client_ctx_._M_t.
                       super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,VerifySucceed,
                       (void *)0x0);
            SSL_CTX_set_cert_verify_callback
                      ((SSL_CTX *)
                       (this->super_SSLVersionTest).server_ctx_._M_t.
                       super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,VerifySucceed,
                       (void *)0x0);
            local_88._24_8_ = 0;
            local_68._8_8_ = 0;
            sStack_50 = 0;
            local_48._8_8_ = 0;
            local_88._0_8_ = (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
            local_88._8_8_ = (stack_st_CRYPTO_BUFFER *)0x0;
            local_68._M_allocated_capacity = 0;
            local_48._M_allocated_capacity = 0;
            local_38._0_4_ = 0;
            local_38._4_1_ = false;
            local_38._5_3_ = 0;
            local_88._16_8_ = &local_68;
            local_58._M_p = (pointer)&local_48;
            gtest_ar_.success_ =
                 SSLVersionTest::Connect(&this->super_SSLVersionTest,(ClientConfig *)local_88);
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            ClientConfig::~ClientConfig((ClientConfig *)local_88);
            if (gtest_ar_.success_ == false) {
              testing::Message::Message((Message *)&local_b0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_88,(internal *)&gtest_ar_,(AssertionResult *)"Connect()",
                         "false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&AStack_b8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x1127,(char *)local_88._0_8_);
              testing::internal::AssertHelper::operator=(&AStack_b8,(Message *)&local_b0);
            }
            else {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_.message_);
              psVar4 = SSL_get_peer_full_cert_chain
                                 ((this->super_SSLVersionTest).client_._M_t.
                                  super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                  super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
              local_b0._M_head_impl =
                   (this_00->_M_t).super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
              __l._M_len = 1;
              __l._M_array = &local_b0._M_head_impl;
              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                        ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_88,__l,
                         (allocator_type *)&AStack_b8);
              gtest_ar_.success_ =
                   ChainsEqual(psVar4,(vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_88);
              gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                        ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)local_88);
              if (gtest_ar_.success_ == false) {
                testing::Message::Message((Message *)&local_b0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_88,(internal *)&gtest_ar_,
                           (AssertionResult *)
                           "ChainsEqual(SSL_get_peer_full_cert_chain(client_.get()), {cert_.get()})"
                           ,"false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&AStack_b8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x112a,(char *)local_88._0_8_);
                testing::internal::AssertHelper::operator=(&AStack_b8,(Message *)&local_b0);
                testing::internal::AssertHelper::~AssertHelper(&AStack_b8);
                std::__cxx11::string::~string((string *)local_88);
                if (local_b0._M_head_impl != (x509_st *)0x0) {
                  (*(code *)(local_b0._M_head_impl)->cert_info->serialNumber)();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_.message_);
              psVar4 = SSL_get_peer_full_cert_chain
                                 ((this->super_SSLVersionTest).server_._M_t.
                                  super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                  super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
              local_b0._M_head_impl =
                   (this_00->_M_t).super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
              __l_00._M_len = 1;
              __l_00._M_array = &local_b0._M_head_impl;
              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                        ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_88,__l_00,
                         (allocator_type *)&AStack_b8);
              gtest_ar_.success_ =
                   ChainsEqual(psVar4,(vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_88);
              gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                        ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)local_88);
              if (gtest_ar_.success_ == false) {
                testing::Message::Message((Message *)&local_b0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_88,(internal *)&gtest_ar_,
                           (AssertionResult *)
                           "ChainsEqual(SSL_get_peer_full_cert_chain(server_.get()), {cert_.get()})"
                           ,"false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&AStack_b8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x112c,(char *)local_88._0_8_);
                testing::internal::AssertHelper::operator=(&AStack_b8,(Message *)&local_b0);
                testing::internal::AssertHelper::~AssertHelper(&AStack_b8);
                std::__cxx11::string::~string((string *)local_88);
                if (local_b0._M_head_impl != (x509_st *)0x0) {
                  (*(code *)(local_b0._M_head_impl)->cert_info->serialNumber)();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_.message_);
              SSL_CTX_clear_mode((this->super_SSLVersionTest).client_ctx_._M_t.
                                 super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,8);
              SSL_CTX_clear_mode((this->super_SSLVersionTest).server_ctx_._M_t.
                                 super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,8);
              local_88._24_8_ = 0;
              local_68._8_8_ = 0;
              sStack_50 = 0;
              local_48._8_8_ = 0;
              local_88._0_8_ = (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
              local_88._8_8_ = (stack_st_CRYPTO_BUFFER *)0x0;
              local_68._M_allocated_capacity = 0;
              local_48._M_allocated_capacity = 0;
              local_38._0_4_ = 0;
              local_38._4_1_ = false;
              local_38._5_3_ = 0;
              local_88._16_8_ = &local_68;
              local_58._M_p = (pointer)&local_48;
              gtest_ar_.success_ =
                   SSLVersionTest::Connect(&this->super_SSLVersionTest,(ClientConfig *)local_88);
              gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              ClientConfig::~ClientConfig((ClientConfig *)local_88);
              if (gtest_ar_.success_ == false) {
                testing::Message::Message((Message *)&local_b0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_88,(internal *)&gtest_ar_,(AssertionResult *)"Connect()",
                           "false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&AStack_b8,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x1131,(char *)local_88._0_8_);
                testing::internal::AssertHelper::operator=(&AStack_b8,(Message *)&local_b0);
              }
              else {
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar_.message_);
                psVar4 = SSL_get_peer_full_cert_chain
                                   ((this->super_SSLVersionTest).client_._M_t.
                                    super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                    super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
                local_b0._M_head_impl =
                     (this_00->_M_t).super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                local_a8.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
                     (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                     (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                     intermediate._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                __l_01._M_len = 2;
                __l_01._M_array = &local_b0._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_88,__l_01,
                           (allocator_type *)&AStack_b8);
                gtest_ar_.success_ =
                     ChainsEqual(psVar4,(vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_88);
                gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                          ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)local_88);
                if (gtest_ar_.success_ == false) {
                  testing::Message::Message((Message *)&local_b0);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_88,(internal *)&gtest_ar_,
                             (AssertionResult *)
                             "ChainsEqual(SSL_get_peer_full_cert_chain(client_.get()), {cert_.get(), intermediate.get()})"
                             ,"false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&AStack_b8,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x1134,(char *)local_88._0_8_);
                  testing::internal::AssertHelper::operator=(&AStack_b8,(Message *)&local_b0);
                  testing::internal::AssertHelper::~AssertHelper(&AStack_b8);
                  std::__cxx11::string::~string((string *)local_88);
                  if (local_b0._M_head_impl != (x509_st *)0x0) {
                    (*(code *)(local_b0._M_head_impl)->cert_info->serialNumber)();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar_.message_);
                psVar4 = SSL_get_peer_full_cert_chain
                                   ((this->super_SSLVersionTest).server_._M_t.
                                    super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                    super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
                local_b0._M_head_impl =
                     (this_00->_M_t).super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                local_a8.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
                     (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                     (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                     intermediate._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                __l_02._M_len = 2;
                __l_02._M_array = &local_b0._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_88,__l_02,
                           (allocator_type *)&AStack_b8);
                gtest_ar_.success_ =
                     ChainsEqual(psVar4,(vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_88);
                gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                          ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)local_88);
                if (gtest_ar_.success_ == false) {
                  testing::Message::Message((Message *)&local_b0);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_88,(internal *)&gtest_ar_,
                             (AssertionResult *)
                             "ChainsEqual(SSL_get_peer_full_cert_chain(server_.get()), {cert_.get(), intermediate.get()})"
                             ,"false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&AStack_b8,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x1136,(char *)local_88._0_8_);
                  testing::internal::AssertHelper::operator=(&AStack_b8,(Message *)&local_b0);
                  testing::internal::AssertHelper::~AssertHelper(&AStack_b8);
                  std::__cxx11::string::~string((string *)local_88);
                  if (local_b0._M_head_impl != (x509_st *)0x0) {
                    (*(code *)(local_b0._M_head_impl)->cert_info->serialNumber)();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar_.message_);
                iVar2 = SSL_CTX_add1_chain_cert
                                  ((this->super_SSLVersionTest).client_ctx_._M_t.
                                   super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                                   (this->super_SSLVersionTest).cert_._M_t.
                                   super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_x509_st_*,_false>._M_head_impl);
                gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                gtest_ar_.success_ = iVar2 != 0;
                if (iVar2 == 0) {
                  testing::Message::Message((Message *)&local_b0);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_88,(internal *)&gtest_ar_,
                             (AssertionResult *)
                             "SSL_CTX_add1_chain_cert(client_ctx_.get(), cert_.get())","false",
                             "true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&AStack_b8,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x1139,(char *)local_88._0_8_);
                  testing::internal::AssertHelper::operator=(&AStack_b8,(Message *)&local_b0);
                }
                else {
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar_.message_);
                  iVar2 = SSL_CTX_add1_chain_cert
                                    ((this->super_SSLVersionTest).server_ctx_._M_t.
                                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t
                                     .super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                                     (this->super_SSLVersionTest).cert_._M_t.
                                     super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                                     super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_x509_st_*,_false>._M_head_impl);
                  gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )0x0;
                  gtest_ar_.success_ = iVar2 != 0;
                  if (iVar2 == 0) {
                    testing::Message::Message((Message *)&local_b0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_88,(internal *)&gtest_ar_,
                               (AssertionResult *)
                               "SSL_CTX_add1_chain_cert(server_ctx_.get(), cert_.get())","false",
                               "true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              (&AStack_b8,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x113a,(char *)local_88._0_8_);
                    testing::internal::AssertHelper::operator=(&AStack_b8,(Message *)&local_b0);
                  }
                  else {
                    std::
                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~unique_ptr(&gtest_ar_.message_);
                    local_88._24_8_ = 0;
                    local_68._8_8_ = 0;
                    sStack_50 = 0;
                    local_48._8_8_ = 0;
                    local_88._0_8_ = (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
                    local_88._8_8_ = (stack_st_CRYPTO_BUFFER *)0x0;
                    local_68._M_allocated_capacity = 0;
                    local_48._M_allocated_capacity = 0;
                    local_38._0_4_ = 0;
                    local_38._4_1_ = false;
                    local_38._5_3_ = 0;
                    local_88._16_8_ = &local_68;
                    local_58._M_p = (pointer)&local_48;
                    gtest_ar_.success_ =
                         SSLVersionTest::Connect
                                   (&this->super_SSLVersionTest,(ClientConfig *)local_88);
                    gtest_ar_.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl =
                         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )0x0;
                    ClientConfig::~ClientConfig((ClientConfig *)local_88);
                    if (gtest_ar_.success_ == false) {
                      testing::Message::Message((Message *)&local_b0);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)local_88,(internal *)&gtest_ar_,
                                 (AssertionResult *)"Connect()","false","true",in_R9);
                      testing::internal::AssertHelper::AssertHelper
                                (&AStack_b8,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                 ,0x113b,(char *)local_88._0_8_);
                      testing::internal::AssertHelper::operator=(&AStack_b8,(Message *)&local_b0);
                    }
                    else {
                      std::
                      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~unique_ptr(&gtest_ar_.message_);
                      psVar4 = SSL_get_peer_full_cert_chain
                                         ((this->super_SSLVersionTest).client_._M_t.
                                          super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                                          _M_t.
                                          super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                          super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
                      local_b0._M_head_impl =
                           (this_00->_M_t).super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                           _M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                      __l_03._M_len = 2;
                      __l_03._M_array = &local_b0._M_head_impl;
                      local_a8.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
                           (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                           (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                           local_b0._M_head_impl;
                      std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                                ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_88,__l_03,
                                 (allocator_type *)&AStack_b8);
                      gtest_ar_.success_ =
                           ChainsEqual(psVar4,(vector<x509_st_*,_std::allocator<x509_st_*>_> *)
                                              local_88);
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl =
                           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )0x0;
                      std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                                ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)local_88);
                      if (gtest_ar_.success_ == false) {
                        testing::Message::Message((Message *)&local_b0);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)local_88,(internal *)&gtest_ar_,
                                   (AssertionResult *)
                                   "ChainsEqual(SSL_get_peer_full_cert_chain(client_.get()), {cert_.get(), cert_.get()})"
                                   ,"false","true",in_R9);
                        testing::internal::AssertHelper::AssertHelper
                                  (&AStack_b8,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                   ,0x113e,(char *)local_88._0_8_);
                        testing::internal::AssertHelper::operator=(&AStack_b8,(Message *)&local_b0);
                        testing::internal::AssertHelper::~AssertHelper(&AStack_b8);
                        std::__cxx11::string::~string((string *)local_88);
                        if (local_b0._M_head_impl != (x509_st *)0x0) {
                          (*(code *)(local_b0._M_head_impl)->cert_info->serialNumber)();
                        }
                      }
                      std::
                      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~unique_ptr(&gtest_ar_.message_);
                      psVar4 = SSL_get_peer_full_cert_chain
                                         ((this->super_SSLVersionTest).server_._M_t.
                                          super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                                          _M_t.
                                          super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                          super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
                      local_b0._M_head_impl =
                           (this_00->_M_t).super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                           _M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                      __l_04._M_len = 2;
                      __l_04._M_array = &local_b0._M_head_impl;
                      local_a8.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
                           (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                           (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                           local_b0._M_head_impl;
                      std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                                ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_88,__l_04,
                                 (allocator_type *)&AStack_b8);
                      gtest_ar_.success_ =
                           ChainsEqual(psVar4,(vector<x509_st_*,_std::allocator<x509_st_*>_> *)
                                              local_88);
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl =
                           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )0x0;
                      std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                                ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)local_88);
                      if (gtest_ar_.success_ == false) {
                        testing::Message::Message((Message *)&local_b0);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)local_88,(internal *)&gtest_ar_,
                                   (AssertionResult *)
                                   "ChainsEqual(SSL_get_peer_full_cert_chain(server_.get()), {cert_.get(), cert_.get()})"
                                   ,"false","true",in_R9);
                        testing::internal::AssertHelper::AssertHelper
                                  (&AStack_b8,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                   ,0x1140,(char *)local_88._0_8_);
                        testing::internal::AssertHelper::operator=(&AStack_b8,(Message *)&local_b0);
                        testing::internal::AssertHelper::~AssertHelper(&AStack_b8);
                        std::__cxx11::string::~string((string *)local_88);
                        if (local_b0._M_head_impl != (x509_st *)0x0) {
                          (*(code *)(local_b0._M_head_impl)->cert_info->serialNumber)();
                        }
                      }
                      std::
                      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~unique_ptr(&gtest_ar_.message_);
                      SSL_CTX_clear_chain_certs
                                ((this->super_SSLVersionTest).client_ctx_._M_t.
                                 super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
                      SSL_CTX_clear_chain_certs
                                ((this->super_SSLVersionTest).server_ctx_._M_t.
                                 super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
                      SSL_CTX_set_cert_cb((this->super_SSLVersionTest).client_ctx_._M_t.
                                          super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>
                                          .super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                                          TestBody::anon_class_1_0_00000001::__invoke,
                                          (this->super_SSLVersionTest).cert_._M_t.
                                          super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                                          _M_t.
                                          super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                          .super__Head_base<0UL,_x509_st_*,_false>._M_head_impl);
                      SSL_CTX_set_cert_cb((this->super_SSLVersionTest).server_ctx_._M_t.
                                          super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>
                                          .super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                                          TestBody::anon_class_1_0_00000001::__invoke,
                                          (this->super_SSLVersionTest).cert_._M_t.
                                          super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                                          _M_t.
                                          super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                          .super__Head_base<0UL,_x509_st_*,_false>._M_head_impl);
                      local_88._24_8_ = 0;
                      local_68._8_8_ = 0;
                      sStack_50 = 0;
                      local_48._8_8_ = 0;
                      local_88._0_8_ = (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
                      local_88._8_8_ = (stack_st_CRYPTO_BUFFER *)0x0;
                      local_68._M_allocated_capacity = 0;
                      local_48._M_allocated_capacity = 0;
                      local_38._0_4_ = 0;
                      local_38._4_1_ = false;
                      local_38._5_3_ = 0;
                      local_88._16_8_ = &local_68;
                      local_58._M_p = (pointer)&local_48;
                      gtest_ar_.success_ =
                           SSLVersionTest::Connect
                                     (&this->super_SSLVersionTest,(ClientConfig *)local_88);
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl =
                           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )0x0;
                      ClientConfig::~ClientConfig((ClientConfig *)local_88);
                      if (gtest_ar_.success_ != false) {
                        std::
                        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::~unique_ptr(&gtest_ar_.message_);
                        psVar4 = SSL_get_peer_full_cert_chain
                                           ((this->super_SSLVersionTest).client_._M_t.
                                            super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                                            _M_t.
                                            super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>
                                            .super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
                        local_b0._M_head_impl =
                             (this_00->_M_t).super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                             ._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                        __l_05._M_len = 2;
                        __l_05._M_array = &local_b0._M_head_impl;
                        local_a8.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
                             (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                             (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                             local_b0._M_head_impl;
                        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_88,__l_05,
                                   (allocator_type *)&AStack_b8);
                        gtest_ar_.success_ =
                             ChainsEqual(psVar4,(vector<x509_st_*,_std::allocator<x509_st_*>_> *)
                                                local_88);
                        gtest_ar_.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl =
                             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )0x0;
                        std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                                  ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)local_88);
                        if (gtest_ar_.success_ == false) {
                          testing::Message::Message((Message *)&local_b0);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)local_88,(internal *)&gtest_ar_,
                                     (AssertionResult *)
                                     "ChainsEqual(SSL_get_peer_full_cert_chain(client_.get()), {cert_.get(), cert_.get()})"
                                     ,"false","true",in_R9);
                          testing::internal::AssertHelper::AssertHelper
                                    (&AStack_b8,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                     ,0x114f,(char *)local_88._0_8_);
                          testing::internal::AssertHelper::operator=
                                    (&AStack_b8,(Message *)&local_b0);
                          testing::internal::AssertHelper::~AssertHelper(&AStack_b8);
                          std::__cxx11::string::~string((string *)local_88);
                          if (local_b0._M_head_impl != (x509_st *)0x0) {
                            (*(code *)(local_b0._M_head_impl)->cert_info->serialNumber)();
                          }
                        }
                        std::
                        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::~unique_ptr(&gtest_ar_.message_);
                        psVar4 = SSL_get_peer_full_cert_chain
                                           ((this->super_SSLVersionTest).server_._M_t.
                                            super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                                            _M_t.
                                            super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>
                                            .super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
                        local_b0._M_head_impl =
                             (this_00->_M_t).super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                             ._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                        __l_06._M_len = 2;
                        __l_06._M_array = &local_b0._M_head_impl;
                        local_a8.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
                             (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                             (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                             local_b0._M_head_impl;
                        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_88,__l_06,
                                   (allocator_type *)&AStack_b8);
                        bVar5 = ChainsEqual(psVar4,(vector<x509_st_*,_std::allocator<x509_st_*>_> *)
                                                   local_88);
                        gtest_ar_.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl =
                             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )0x0;
                        gtest_ar_.success_ = bVar5;
                        std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                                  ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)local_88);
                        if (!bVar5) {
                          testing::Message::Message((Message *)&local_b0);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)local_88,(internal *)&gtest_ar_,
                                     (AssertionResult *)
                                     "ChainsEqual(SSL_get_peer_full_cert_chain(server_.get()), {cert_.get(), cert_.get()})"
                                     ,"false","true",in_R9);
                          testing::internal::AssertHelper::AssertHelper
                                    (&AStack_b8,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                     ,0x1151,(char *)local_88._0_8_);
                          testing::internal::AssertHelper::operator=
                                    (&AStack_b8,(Message *)&local_b0);
                          testing::internal::AssertHelper::~AssertHelper(&AStack_b8);
                          std::__cxx11::string::~string((string *)local_88);
                          if (local_b0._M_head_impl != (x509_st *)0x0) {
                            (*(code *)(local_b0._M_head_impl)->cert_info->serialNumber)();
                          }
                        }
                        goto LAB_0017ba27;
                      }
                      testing::Message::Message((Message *)&local_b0);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)local_88,(internal *)&gtest_ar_,
                                 (AssertionResult *)"Connect()","false","true",in_R9);
                      testing::internal::AssertHelper::AssertHelper
                                (&AStack_b8,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                 ,0x114c,(char *)local_88._0_8_);
                      testing::internal::AssertHelper::operator=(&AStack_b8,(Message *)&local_b0);
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
        testing::Message::Message((Message *)&local_b0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_88,(internal *)&gtest_ar_,
                   (AssertionResult *)"UseCertAndKey(server_ctx_.get())","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&AStack_b8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1115,(char *)local_88._0_8_);
        testing::internal::AssertHelper::operator=(&AStack_b8,(Message *)&local_b0);
      }
    }
    else {
      testing::Message::Message((Message *)&local_b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_88,(internal *)&gtest_ar_,
                 (AssertionResult *)"UseCertAndKey(client_ctx_.get())","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1114,(char *)local_88._0_8_);
      testing::internal::AssertHelper::operator=(&AStack_b8,(Message *)&local_b0);
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&AStack_b8);
  std::__cxx11::string::~string((string *)local_88);
  if (local_b0._M_head_impl != (x509_st *)0x0) {
    (*(code *)(local_b0._M_head_impl)->cert_info->serialNumber)();
  }
LAB_0017ba27:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&intermediate);
  return;
}

Assistant:

TEST_P(SSLVersionTest, AutoChain) {
  cert_ = GetChainTestCertificate();
  ASSERT_TRUE(cert_);
  key_ = GetChainTestKey();
  ASSERT_TRUE(key_);
  bssl::UniquePtr<X509> intermediate = GetChainTestIntermediate();
  ASSERT_TRUE(intermediate);

  ASSERT_TRUE(UseCertAndKey(client_ctx_.get()));
  ASSERT_TRUE(UseCertAndKey(server_ctx_.get()));

  // Configure both client and server to accept any certificate. Add
  // |intermediate| to the cert store.
  ASSERT_TRUE(X509_STORE_add_cert(SSL_CTX_get_cert_store(client_ctx_.get()),
                                  intermediate.get()));
  ASSERT_TRUE(X509_STORE_add_cert(SSL_CTX_get_cert_store(server_ctx_.get()),
                                  intermediate.get()));
  SSL_CTX_set_verify(client_ctx_.get(),
                     SSL_VERIFY_PEER | SSL_VERIFY_FAIL_IF_NO_PEER_CERT,
                     nullptr);
  SSL_CTX_set_verify(server_ctx_.get(),
                     SSL_VERIFY_PEER | SSL_VERIFY_FAIL_IF_NO_PEER_CERT,
                     nullptr);
  SSL_CTX_set_cert_verify_callback(client_ctx_.get(), VerifySucceed, NULL);
  SSL_CTX_set_cert_verify_callback(server_ctx_.get(), VerifySucceed, NULL);

  // By default, the client and server should each only send the leaf.
  ASSERT_TRUE(Connect());

  EXPECT_TRUE(
      ChainsEqual(SSL_get_peer_full_cert_chain(client_.get()), {cert_.get()}));
  EXPECT_TRUE(
      ChainsEqual(SSL_get_peer_full_cert_chain(server_.get()), {cert_.get()}));

  // If auto-chaining is enabled, then the intermediate is sent.
  SSL_CTX_clear_mode(client_ctx_.get(), SSL_MODE_NO_AUTO_CHAIN);
  SSL_CTX_clear_mode(server_ctx_.get(), SSL_MODE_NO_AUTO_CHAIN);
  ASSERT_TRUE(Connect());

  EXPECT_TRUE(ChainsEqual(SSL_get_peer_full_cert_chain(client_.get()),
                          {cert_.get(), intermediate.get()}));
  EXPECT_TRUE(ChainsEqual(SSL_get_peer_full_cert_chain(server_.get()),
                          {cert_.get(), intermediate.get()}));

  // Auto-chaining does not override explicitly-configured intermediates.
  ASSERT_TRUE(SSL_CTX_add1_chain_cert(client_ctx_.get(), cert_.get()));
  ASSERT_TRUE(SSL_CTX_add1_chain_cert(server_ctx_.get(), cert_.get()));
  ASSERT_TRUE(Connect());

  EXPECT_TRUE(ChainsEqual(SSL_get_peer_full_cert_chain(client_.get()),
                          {cert_.get(), cert_.get()}));
  EXPECT_TRUE(ChainsEqual(SSL_get_peer_full_cert_chain(server_.get()),
                          {cert_.get(), cert_.get()}));

  // Auto-chaining does not override explicitly-configured intermediates that
  // are configured as late as cert_cb. If this fails, something in the
  // handshake is likely auto-chaining too early.
  SSL_CTX_clear_chain_certs(client_ctx_.get());
  SSL_CTX_clear_chain_certs(server_ctx_.get());
  auto install_intermediate = [](SSL *ssl, void *arg) -> int {
    return SSL_add1_chain_cert(ssl, static_cast<X509 *>(arg));
  };
  SSL_CTX_set_cert_cb(client_ctx_.get(), install_intermediate, cert_.get());
  SSL_CTX_set_cert_cb(server_ctx_.get(), install_intermediate, cert_.get());
  ASSERT_TRUE(Connect());

  EXPECT_TRUE(ChainsEqual(SSL_get_peer_full_cert_chain(client_.get()),
                          {cert_.get(), cert_.get()}));
  EXPECT_TRUE(ChainsEqual(SSL_get_peer_full_cert_chain(server_.get()),
                          {cert_.get(), cert_.get()}));
}